

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O3

void pem_des3_decrypt(uchar *des3_iv,uchar *buf,size_t buflen,uchar *pwd,size_t pwdlen)

{
  long lVar1;
  uchar des3_key [24];
  mbedtls_des3_context des3_ctx;
  uchar local_1c8 [24];
  mbedtls_des3_context local_1b0;
  
  mbedtls_des3_init(&local_1b0);
  pem_pbkdf1(local_1c8,0x18,des3_iv,pwd,pwdlen);
  mbedtls_des3_set3key_dec(&local_1b0,local_1c8);
  lVar1 = 0;
  mbedtls_des3_crypt_cbc(&local_1b0,0,buflen,des3_iv,buf,buf);
  mbedtls_des3_free(&local_1b0);
  do {
    local_1c8[lVar1] = '\0';
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x18);
  return;
}

Assistant:

static void pem_des3_decrypt( unsigned char des3_iv[8],
                               unsigned char *buf, size_t buflen,
                               const unsigned char *pwd, size_t pwdlen )
{
    mbedtls_des3_context des3_ctx;
    unsigned char des3_key[24];

    mbedtls_des3_init( &des3_ctx );

    pem_pbkdf1( des3_key, 24, des3_iv, pwd, pwdlen );

    mbedtls_des3_set3key_dec( &des3_ctx, des3_key );
    mbedtls_des3_crypt_cbc( &des3_ctx, MBEDTLS_DES_DECRYPT, buflen,
                     des3_iv, buf, buf );

    mbedtls_des3_free( &des3_ctx );
    mbedtls_zeroize( des3_key, 24 );
}